

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O2

void __thiscall
duckdb::ChimpGroupState<unsigned_int>::LoadValues
          (ChimpGroupState<unsigned_int> *this,uint *result,idx_t count)

{
  uint uVar1;
  idx_t i;
  idx_t iVar2;
  
  for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
    uVar1 = Chimp128Decompression<unsigned_int>::Load
                      (this->flags[iVar2],this->leading_zeros,&this->leading_zero_index,
                       this->unpacked_data_blocks,&this->unpacked_index,&this->chimp_state);
    result[iVar2] = uVar1;
  }
  return;
}

Assistant:

void LoadValues(CHIMP_TYPE *result, idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			result[i] = Chimp128Decompression<CHIMP_TYPE>::Load(flags[i], leading_zeros, leading_zero_index,
			                                                    unpacked_data_blocks, unpacked_index, chimp_state);
		}
	}